

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O0

void trie_node_iterate(trie t,trie_node n,trie_cb_iterate iterate_cb,trie_cb_iterate_args args)

{
  long lVar1;
  int iVar2;
  vector v;
  size_t sVar3;
  long *plVar4;
  set_iterator it_00;
  set_value pvVar5;
  undefined8 in_RCX;
  code *in_RDX;
  long in_RSI;
  long in_RDI;
  trie_node current_node;
  trie_node_ref ref_node;
  set_iterator it;
  trie_node back;
  trie_node *back_ptr;
  vector node_stack;
  set in_stack_ffffffffffffffa8;
  vector in_stack_ffffffffffffffb0;
  
  if (((in_RDI != 0) && (in_RSI != 0)) && (in_RDX != (code *)0x0)) {
    v = vector_create(0x106306);
    vector_push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    while (sVar3 = vector_size(v), sVar3 != 0) {
      plVar4 = (long *)vector_back((vector)in_stack_ffffffffffffffa8);
      vector_pop_back((vector)0x106347);
      if ((plVar4 != (long *)0x0) && (*plVar4 != 0)) {
        lVar1 = *plVar4;
        if (*(long *)(lVar1 + 0x20) != 0) {
          it_00 = set_iterator_begin(in_stack_ffffffffffffffa8);
          while (iVar2 = set_iterator_end((set_iterator *)in_stack_ffffffffffffffa8), 0 < iVar2) {
            pvVar5 = set_iterator_get_value(it_00);
            vector_push_back((vector)(*(long *)(in_RDI + 8) + *(long *)((long)pvVar5 + 8) * 0x28),
                             in_stack_ffffffffffffffa8);
            set_iterator_next(it_00);
          }
        }
        (*in_RDX)(in_RDI,*(undefined8 *)(lVar1 + 0x10),*(undefined8 *)(lVar1 + 0x18),in_RCX);
      }
    }
    vector_destroy((vector)0x106416);
  }
  return;
}

Assistant:

void trie_node_iterate(trie t, trie_node n, trie_cb_iterate iterate_cb, trie_cb_iterate_args args)
{
	if (t != NULL && n != NULL && iterate_cb != NULL)
	{
		vector node_stack = vector_create(sizeof(trie_node));

		vector_push_back(node_stack, &n);

		while (vector_size(node_stack) > 0)
		{
			trie_node *back_ptr = vector_back(node_stack);

			vector_pop_back(node_stack);

			if (back_ptr != NULL && *back_ptr != NULL)
			{
				trie_node back = *back_ptr;

				if (back->childs != NULL)
				{
					set_iterator it;
					for (it = set_iterator_begin(back->childs); set_iterator_end(&it) > 0; set_iterator_next(it))
					{
						trie_node_ref ref_node = set_iterator_get_value(it);

						trie_node current_node = &t->node_list[ref_node->index];

						vector_push_back(node_stack, &current_node);
					}
				}

				iterate_cb(t, back->key, back->value, args);
			}
		}

		vector_destroy(node_stack);
	}
}